

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSTL.h
# Opt level: O0

void __thiscall adios2::format::BufferSTL::~BufferSTL(BufferSTL *this)

{
  BufferSTL *in_RDI;
  
  ~BufferSTL(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~BufferSTL() = default;